

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O0

void OpenMD::registerOptimizers(void)

{
  allocator<char> *__a;
  char *__s;
  OptimizationFactory *this;
  string *in_stack_ffffffffffffff28;
  OptimizationBuilder<QuantLib::ConjugateGradient> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_81;
  string local_80 [38];
  undefined1 local_5a;
  allocator<char> local_59;
  OptimizationCreator *in_stack_ffffffffffffffa8;
  OptimizationFactory *in_stack_ffffffffffffffb0;
  undefined1 local_21 [33];
  
  __a = (allocator<char> *)OptimizationFactory::getInstance();
  __s = (char *)operator_new(0x28);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  OptimizationBuilder<QuantLib::SteepestDescent>::OptimizationBuilder
            ((OptimizationBuilder<QuantLib::SteepestDescent> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  OptimizationFactory::registerOptimization(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)(local_21 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_21);
  OptimizationFactory::getInstance();
  operator_new(0x28);
  local_5a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  OptimizationBuilder<QuantLib::ConjugateGradient>::OptimizationBuilder
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_5a = 0;
  OptimizationFactory::registerOptimization(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator(&local_59);
  this = OptimizationFactory::getInstance();
  operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  OptimizationBuilder<QuantLib::BFGS>::OptimizationBuilder
            ((OptimizationBuilder<QuantLib::BFGS> *)this,in_stack_ffffffffffffff28);
  OptimizationFactory::registerOptimization(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

void registerOptimizers() {
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::SteepestDescent>("SD"));
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::ConjugateGradient>("CG"));
    OptimizationFactory::getInstance().registerOptimization(
        new OptimizationBuilder<QuantLib::BFGS>("BFGS"));
  }